

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
gch::detail::small_vector_base<std::allocator<long_double>,_32U>::wipe
          (small_vector_base<std::allocator<long_double>,_32U> *this)

{
  ulong uVar1;
  
  uVar1 = (this->m_data).super_small_vector_data_base<long_double_*,_unsigned_long>.m_capacity;
  if (0x20 < uVar1) {
    operator_delete((this->m_data).super_small_vector_data_base<long_double_*,_unsigned_long>.
                    m_data_ptr,uVar1 << 4);
    return;
  }
  return;
}

Assistant:

constexpr ptr     data_ptr (void) const noexcept { return m_data_ptr; }